

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

Gia_Man_t *
Gia_ManLutBalance(Gia_Man_t *p,int nLutSize,int fUseMuxes,int fRecursive,int fOptArea,int fVerbose)

{
  int *__ptr;
  int iVar1;
  Tim_Man_t *pTVar2;
  Gia_Man_t *pGVar3;
  Str_Ntk_t *p_00;
  Gia_Man_t *p_01;
  long lVar4;
  long lVar5;
  timespec ts;
  timespec local_48;
  Tim_Man_t *local_38;
  
  iVar1 = clock_gettime(3,&local_48);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if ((((Tim_Man_t *)p->pManTime == (Tim_Man_t *)0x0) ||
      (iVar1 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime), iVar1 == 0)) ||
     (iVar1 = Gia_ManIsNormalized(p), iVar1 == 0)) {
    p_00 = Str_ManNormalize(p);
    pGVar3 = Str_NtkBalance(p,p_00,nLutSize,fUseMuxes,fRecursive,fOptArea,fVerbose);
    Gia_ManTransferTiming(pGVar3,p);
  }
  else {
    local_38 = (Tim_Man_t *)p->pManTime;
    pTVar2 = Tim_ManDup(local_38,0x10);
    p->pManTime = pTVar2;
    pGVar3 = Gia_ManDupUnnormalize(p);
    if (pGVar3 == (Gia_Man_t *)0x0) {
      return (Gia_Man_t *)0x0;
    }
    Gia_ManTransferTiming(pGVar3,p);
    p_00 = Str_ManNormalize(pGVar3);
    p_01 = Str_NtkBalance(pGVar3,p_00,nLutSize,fUseMuxes,fRecursive,fOptArea,fVerbose);
    Gia_ManTransferTiming(p_01,pGVar3);
    Gia_ManStop(pGVar3);
    pGVar3 = Gia_ManDupNormalize(p_01,0);
    Gia_ManTransferTiming(pGVar3,p_01);
    Gia_ManStop(p_01);
    Tim_ManStop((Tim_Man_t *)pGVar3->pManTime);
    pGVar3->pManTime = local_38;
    iVar1 = Gia_ManIsNormalized(pGVar3);
    if (iVar1 == 0) {
      __assert_fail("Gia_ManIsNormalized(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                    ,0x57c,"Gia_Man_t *Gia_ManLutBalance(Gia_Man_t *, int, int, int, int, int)");
    }
  }
  if (fVerbose != 0) {
    iVar1 = clock_gettime(3,&local_48);
    if (iVar1 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    iVar1 = 0xa58892;
    printf("Network contains %d ands, %d xors, %d muxes (%d trees in %d groups).  ",
           (ulong)(uint)p_00->nObjCount[3],(ulong)(uint)p_00->nObjCount[4],
           (ulong)(uint)p_00->nObjCount[5],(ulong)(uint)p_00->nTrees,(ulong)(uint)p_00->nGroups);
    Abc_Print(iVar1,"%s =","Time");
    Abc_Print(iVar1,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
  }
  __ptr = (p_00->vFanins).pArray;
  if (__ptr != (int *)0x0) {
    free(__ptr);
    (p_00->vFanins).pArray = (int *)0x0;
  }
  if (p_00->pObjs != (Str_Obj_t *)0x0) {
    free(p_00->pObjs);
  }
  free(p_00);
  return pGVar3;
}

Assistant:

Gia_Man_t * Gia_ManLutBalance( Gia_Man_t * p, int nLutSize, int fUseMuxes, int fRecursive, int fOptArea, int fVerbose )
{
    Str_Ntk_t * pNtk;
    Gia_Man_t * pNew;
    abctime clk = Abc_Clock();
    if ( p->pManTime && Tim_ManBoxNum((Tim_Man_t*)p->pManTime) && Gia_ManIsNormalized(p) )
    {
        Tim_Man_t * pTimOld = (Tim_Man_t *)p->pManTime;
        p->pManTime = Tim_ManDup( pTimOld, 16 );
        pNew = Gia_ManDupUnnormalize( p );
        if ( pNew == NULL )
            return NULL;
        Gia_ManTransferTiming( pNew, p );
        p = pNew;
        // optimize
        pNtk = Str_ManNormalize( p );
        pNew = Str_NtkBalance( p, pNtk, nLutSize, fUseMuxes, fRecursive, fOptArea, fVerbose );
        Gia_ManTransferTiming( pNew, p );
        Gia_ManStop( p );
        // normalize
        pNew = Gia_ManDupNormalize( p = pNew, 0 );
        Gia_ManTransferTiming( pNew, p );
        Gia_ManStop( p );
        // cleanup
        Tim_ManStop( (Tim_Man_t *)pNew->pManTime );
        pNew->pManTime = pTimOld;
        assert( Gia_ManIsNormalized(pNew) );
    }
    else 
    {
        pNtk = Str_ManNormalize( p );
    //    Str_NtkPrintGroups( pNtk );
        pNew = Str_NtkBalance( p, pNtk, nLutSize, fUseMuxes, fRecursive, fOptArea, fVerbose );
        Gia_ManTransferTiming( pNew, p );
    }
    if ( fVerbose )
        Str_NtkPs( pNtk, Abc_Clock() - clk );
    Str_NtkDelete( pNtk );   
    return pNew;
}